

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestinitiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequest::
TestinitiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequest
          (TestinitiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequest *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"LogOnResponse_ReceivedResponseBeforeSendingLogOnRequest",
             "SessionTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x7cd);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00320490;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LogOnResponse_ReceivedResponseBeforeSendingLogOnRequest) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;

  object->logon();
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );

  CHECK(!object->sentLogout());
}